

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderType shaderType)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  ostringstream source;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${GLSL_VERSION_STRING}\n",0x17);
  switch((int)this) {
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"layout(points) in;\n",0x13);
    lVar2 = 0x2a;
    pcVar3 = "layout(line_strip, max_vertices = 3) out;\n";
    break;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"${GLSL_TESS_EXTENSION_STRING}\n",0x1e);
    lVar2 = 0x1b;
    pcVar3 = "layout(vertices = 10) out;\n";
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"${GLSL_TESS_EXTENSION_STRING}\n",0x1e);
    lVar2 = 0x16;
    pcVar3 = "layout(triangles) in;\n";
    break;
  case 5:
    lVar2 = 0x1e;
    pcVar3 = "layout (local_size_x = 1) in;\n";
    break;
  default:
    goto switchD_0168177c_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,lVar2);
switchD_0168177c_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${COMPUTE_BUILT_IN_CONSTANTS_STRING}",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return psVar1;
}

Assistant:

string genBuiltInSource (glu::ShaderType shaderType)
{
	std::ostringstream		source;
	source << "${GLSL_VERSION_STRING}\n";

	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:
		case glu::SHADERTYPE_FRAGMENT:
			break;

		case glu::SHADERTYPE_COMPUTE:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(vertices = 10) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "${GLSL_TESS_EXTENSION_STRING}\n"
				   << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source	<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "${COMPUTE_BUILT_IN_CONSTANTS_STRING}"
			<< "}\n";

	return source.str();
}